

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ForVariableDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForVariableDeclarationSyntax,slang::syntax::ForVariableDeclarationSyntax_const&>
          (BumpAllocator *this,ForVariableDeclarationSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  DataTypeSyntax *pDVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  ForVariableDeclarationSyntax *pFVar10;
  
  pFVar10 = (ForVariableDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ForVariableDeclarationSyntax *)this->endPtr < pFVar10 + 1) {
    pFVar10 = (ForVariableDeclarationSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pFVar10 + 1);
  }
  (pFVar10->declarator).ptr = (args->declarator).ptr;
  SVar8 = (args->super_SyntaxNode).kind;
  uVar9 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar4 = (args->varKeyword).kind;
  uVar5 = (args->varKeyword).field_0x2;
  NVar6.raw = (args->varKeyword).numFlags.raw;
  uVar7 = (args->varKeyword).rawLen;
  pDVar3 = args->type;
  (pFVar10->varKeyword).info = (args->varKeyword).info;
  pFVar10->type = pDVar3;
  (pFVar10->super_SyntaxNode).previewNode = pSVar2;
  (pFVar10->varKeyword).kind = TVar4;
  (pFVar10->varKeyword).field_0x2 = uVar5;
  (pFVar10->varKeyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pFVar10->varKeyword).rawLen = uVar7;
  (pFVar10->super_SyntaxNode).kind = SVar8;
  *(undefined4 *)&(pFVar10->super_SyntaxNode).field_0x4 = uVar9;
  (pFVar10->super_SyntaxNode).parent = pSVar1;
  return pFVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }